

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O2

void Dch_CnfNodeAddToSolver(Dch_Man_t *p,Aig_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Vec_Ptr_t *vFrontier;
  void **ppvVar3;
  Aig_Obj_t *pNode;
  void *pvVar4;
  int i;
  
  if (p->pSatVars[pObj->Id] != 0) {
    return;
  }
  vFrontier = (Vec_Ptr_t *)malloc(0x10);
  vFrontier->nCap = 100;
  vFrontier->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vFrontier->pArray = ppvVar3;
  Dch_ObjAddToFrontier(p,pObj,vFrontier);
  i = 0;
  while( true ) {
    if (vFrontier->nSize <= i) {
      free(vFrontier->pArray);
      free(vFrontier);
      return;
    }
    pNode = (Aig_Obj_t *)Vec_PtrEntry(vFrontier,i);
    if (p->pSatVars[pNode->Id] == 0) break;
    iVar2 = Aig_ObjIsMuxType(pNode);
    pVVar1 = p->vFanins;
    if (iVar2 == 0) {
      Dch_CollectSuper(pNode,1,pVVar1);
      for (iVar2 = 0; pVVar1 = p->vFanins, iVar2 < pVVar1->nSize; iVar2 = iVar2 + 1) {
        pvVar4 = Vec_PtrEntry(pVVar1,iVar2);
        Dch_ObjAddToFrontier(p,(Aig_Obj_t *)((ulong)pvVar4 & 0xfffffffffffffffe),vFrontier);
      }
      Dch_AddClausesSuper(p,pNode,pVVar1);
    }
    else {
      pVVar1->nSize = 0;
      Vec_PtrPushUnique(pVVar1,(void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 8)
                                       & 0xfffffffffffffffe));
      Vec_PtrPushUnique(p->vFanins,
                        (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 8) &
                                0xfffffffffffffffe));
      Vec_PtrPushUnique(p->vFanins,
                        (void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x10) &
                                0xfffffffffffffffe));
      Vec_PtrPushUnique(p->vFanins,
                        (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x10) &
                                0xfffffffffffffffe));
      for (iVar2 = 0; iVar2 < p->vFanins->nSize; iVar2 = iVar2 + 1) {
        pvVar4 = Vec_PtrEntry(p->vFanins,iVar2);
        Dch_ObjAddToFrontier(p,(Aig_Obj_t *)((ulong)pvVar4 & 0xfffffffffffffffe),vFrontier);
      }
      Dch_AddClausesMux(p,pNode);
    }
    i = i + 1;
    if (p->vFanins->nSize < 2) {
      __assert_fail("Vec_PtrSize(p->vFanins) > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                    ,0x141,"void Dch_CnfNodeAddToSolver(Dch_Man_t *, Aig_Obj_t *)");
    }
  }
  __assert_fail("Dch_ObjSatNum(p,pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                ,0x12e,"void Dch_CnfNodeAddToSolver(Dch_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Dch_CnfNodeAddToSolver( Dch_Man_t * p, Aig_Obj_t * pObj )
{ 
    Vec_Ptr_t * vFrontier;
    Aig_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    // quit if CNF is ready
    if ( Dch_ObjSatNum(p,pObj) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    Dch_ObjAddToFrontier( p, pObj, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Aig_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Dch_ObjSatNum(p,pNode) );
        if ( fUseMuxes && Aig_ObjIsMuxType(pNode) )
        {
            Vec_PtrClear( p->vFanins );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Dch_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Dch_AddClausesMux( p, pNode );
        }
        else
        {
            Dch_CollectSuper( pNode, fUseMuxes, p->vFanins );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Dch_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Dch_AddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_PtrSize(p->vFanins) > 1 );
    }
    Vec_PtrFree( vFrontier );
}